

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string_view __thiscall libtorrent::aux::strip_string(aux *this,string_view in)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  aux *paVar4;
  string_view sVar5;
  
  pbVar2 = (byte *)in._M_len;
  pbVar1 = pbVar2 + (long)this;
  while (((pbVar3 = pbVar1, this != (aux *)0x0 && (pbVar3 = pbVar2, (ulong)*pbVar2 < 0x21)) &&
         ((0x100003e00U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
    pbVar2 = pbVar2 + 1;
    this = this + -1;
  }
  do {
    paVar4 = this;
    if ((paVar4 == (aux *)0x0) || (0x20 < (ulong)(pbVar3 + -1)[(long)paVar4])) break;
    this = paVar4 + -1;
  } while ((0x100003e00U >> ((ulong)(pbVar3 + -1)[(long)paVar4] & 0x3f) & 1) != 0);
  sVar5._M_str = (char *)pbVar3;
  sVar5._M_len = (size_t)paVar4;
  return sVar5;
}

Assistant:

string_view strip_string(string_view in)
	{
		while (!in.empty() && is_space(in.front()))
			in.remove_prefix(1);

		while (!in.empty() && is_space(in.back()))
			in.remove_suffix(1);
		return in;
	}